

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Members * __thiscall Json::Value::getMemberNames_abi_cxx11_(Value *this)

{
  bool bVar1;
  uint uVar2;
  reference ppVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  Members *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  ostringstream oss;
  Members *members;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_fffffffffffffdb8;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdd0;
  allocator *paVar4;
  allocator local_201;
  string local_200 [32];
  iterator local_1e0;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1d8;
  iterator local_1d0;
  undefined1 local_1c8 [64];
  ostringstream local_188 [392];
  
  if ((((ulong)(in_RSI->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish & 0xff) != 0) &&
     (((ulong)(in_RSI->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish & 0xff) != 8)) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,
                    "in Json::Value::getMemberNames(), value must be objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffdd0);
    std::__cxx11::string::~string((string *)(local_1c8 + 0x10));
    abort();
  }
  if (((ulong)(in_RSI->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish & 0xff) == 0) {
    memset(in_RDI,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x188b64);
  }
  else {
    local_1c8[0xf] = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x188b7b);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            *)0x188b88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(in_RSI,(size_type)in_RDI);
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::begin(in_stack_fffffffffffffdb8);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
               local_1c8,&local_1d0);
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end(in_stack_fffffffffffffdb8);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1d8,&local_1e0);
    while (bVar1 = std::operator!=((_Self *)local_1c8,&local_1d8), bVar1) {
      __x = (value_type *)local_1c8;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          *)in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CZString::data(&ppVar3->first);
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          *)in_stack_fffffffffffffdc0);
      uVar2 = CZString::length(&ppVar3->first);
      paVar4 = &local_201;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,(char *)in_stack_fffffffffffffdc0,(ulong)uVar2,paVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffdc0,__x);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                 in_stack_fffffffffffffdc0);
    }
  }
  return in_RDI;
}

Assistant:

Value::Members Value::getMemberNames() const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::getMemberNames(), value must be objectValue");
  if (type_ == nullValue)
    return Value::Members();
  Members members;
  members.reserve(value_.map_->size());
  ObjectValues::const_iterator it = value_.map_->begin();
  ObjectValues::const_iterator itEnd = value_.map_->end();
  for (; it != itEnd; ++it) {
    members.push_back(std::string((*it).first.data(),
                                  (*it).first.length()));
  }
  return members;
}